

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

Block * __thiscall
VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>
          (VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *this)

{
  ItemBlock *pIVar1;
  long in_RDI;
  Block *result;
  Item *pItem;
  ItemBlock *newBlock;
  Block *result_1;
  Item *pItem_1;
  ItemBlock *block;
  size_t i;
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *in_stack_ffffffffffffffd0;
  Item *pIVar2;
  size_t local_18;
  
  local_18 = VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
             ::size((VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
                     *)(in_RDI + 0x10));
  do {
    if (local_18 == 0) {
      pIVar1 = CreateNewBlock(in_stack_ffffffffffffffd0);
      pIVar2 = pIVar1->pItems;
      pIVar1->FirstFreeIndex = pIVar2->NextFreeIndex;
      memset(pIVar2,0,0x30);
      return (Block *)pIVar2;
    }
    pIVar1 = VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
             ::operator[]((VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
                           *)(in_RDI + 0x10),local_18 - 1);
    local_18 = local_18 - 1;
  } while (pIVar1->FirstFreeIndex == 0xffffffff);
  pIVar2 = pIVar1->pItems + pIVar1->FirstFreeIndex;
  pIVar1->FirstFreeIndex = pIVar2->NextFreeIndex;
  memset(pIVar2,0,0x30);
  return (Block *)pIVar2;
}

Assistant:

T* VmaPoolAllocator<T>::Alloc(Types&&... args)
{
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];
        // This block has some free items: Use first one.
        if (block.FirstFreeIndex != UINT32_MAX)
        {
            Item* const pItem = &block.pItems[block.FirstFreeIndex];
            block.FirstFreeIndex = pItem->NextFreeIndex;
            T* result = (T*)&pItem->Value;
            new(result)T(std::forward<Types>(args)...); // Explicit constructor call.
            return result;
        }
    }

    // No block has free item: Create new one and use it.
    ItemBlock& newBlock = CreateNewBlock();
    Item* const pItem = &newBlock.pItems[0];
    newBlock.FirstFreeIndex = pItem->NextFreeIndex;
    T* result = (T*)&pItem->Value;
    new(result) T(std::forward<Types>(args)...); // Explicit constructor call.
    return result;
}